

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

void vli_mmod_fast_secp256k1(uECC_word_t *result,uECC_word_t *product)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  wordcount_t i;
  wordcount_t i_1;
  uint uVar6;
  wordcount_t i_2;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong local_48 [9];
  
  local_48[6] = 0;
  local_48[7] = 0;
  local_48[5] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  lVar9 = 4;
  local_48[4] = 0;
  do {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_48[4];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = product[lVar9];
    auVar4 = ZEXT816(0x1000003d1) * auVar2 + auVar4;
    local_48[4] = auVar4._8_8_;
    local_48[lVar9 + -4] = auVar4._0_8_;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 8);
  lVar9 = 0;
  uVar12 = 0;
  do {
    uVar8 = product[lVar9];
    uVar11 = uVar8 + uVar12 + local_48[lVar9];
    uVar10 = (ulong)(uVar11 < uVar8);
    if (uVar11 == uVar8) {
      uVar10 = uVar12;
    }
    result[lVar9] = uVar11;
    lVar9 = lVar9 + 1;
    uVar12 = uVar10;
  } while (lVar9 != 4);
  product[2] = 0;
  product[3] = 0;
  *product = 0;
  product[1] = 0;
  lVar9 = 4;
  uVar12 = 0;
  do {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar12;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_48[lVar9];
    auVar5 = ZEXT816(0x1000003d1) * auVar3 + auVar5;
    uVar12 = auVar5._8_8_;
    product[lVar9 + -4] = auVar5._0_8_;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 8);
  product[4] = uVar12;
  lVar9 = 0;
  uVar12 = 0;
  do {
    uVar8 = result[lVar9];
    uVar13 = uVar8 + uVar12 + product[lVar9];
    uVar11 = (ulong)(uVar13 < uVar8);
    if (uVar13 == uVar8) {
      uVar11 = uVar12;
    }
    result[lVar9] = uVar13;
    lVar9 = lVar9 + 1;
    uVar12 = uVar11;
  } while (lVar9 != 4);
  for (lVar9 = uVar11 + uVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
    lVar7 = 0;
    uVar12 = 0;
    do {
      uVar10 = curve_secp256k1.p[lVar7] + uVar12;
      puVar1 = result + lVar7;
      uVar8 = *puVar1;
      *puVar1 = *puVar1 - uVar10;
      if (uVar10 != 0) {
        uVar12 = (ulong)(uVar8 < uVar10);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
  }
  uVar6 = 3;
  while( true ) {
    if ((char)uVar6 < '\0') {
      return;
    }
    uVar8 = (ulong)((uVar6 & 0x7f) << 3);
    uVar12 = *(ulong *)((long)result + uVar8);
    uVar8 = *(ulong *)((long)curve_secp256k1.p + uVar8);
    if (uVar8 < uVar12) break;
    uVar6 = uVar6 - 1;
    if (uVar12 < uVar8) {
      return;
    }
  }
  lVar9 = 0;
  uVar12 = 0;
  do {
    uVar10 = curve_secp256k1.p[lVar9] + uVar12;
    puVar1 = result + lVar9;
    uVar8 = *puVar1;
    *puVar1 = *puVar1 - uVar10;
    if (uVar10 != 0) {
      uVar12 = (ulong)(uVar8 < uVar10);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  return;
}

Assistant:

uECC_VLI_API void uECC_vli_clear(uECC_word_t *vli, wordcount_t num_words) {
    wordcount_t i;
    for (i = 0; i < num_words; ++i) {
        vli[i] = 0;
    }
}